

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeLeaveCoPrhs
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  bool bVar1;
  int iVar2;
  DataKey *pDVar3;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SPxId l_id;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SPxColId local_24;
  int in_stack_ffffffffffffffe8;
  int i_00;
  int iVar4;
  int iVar5;
  
  iVar2 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x328f48);
  while (iVar5 = iVar2 + -1, -1 < iVar5) {
    pDVar3 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::baseId(in_RDI,in_stack_ffffffffffffffcc)->super_DataKey;
    i_00 = (*pDVar3).info;
    iVar4 = (*pDVar3).idx;
    bVar1 = SPxId::isSPxRowId((SPxId *)&stack0xffffffffffffffec);
    iVar2 = iVar5;
    if (bVar1) {
      SPxRowId::SPxRowId((SPxRowId *)&stack0xffffffffffffffe4,(SPxId *)&stack0xffffffffffffffec);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDI,(SPxRowId *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
      computeLeaveCoPrhs4Row
                ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(iVar2,iVar4),i_00,in_stack_ffffffffffffffe8);
      in_stack_ffffffffffffffcc = iVar5;
    }
    else {
      SPxColId::SPxColId(&local_24,(SPxId *)&stack0xffffffffffffffec);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDI,(SPxColId *)CONCAT44(in_stack_ffffffffffffffcc,iVar5));
      computeLeaveCoPrhs4Col
                ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(iVar2,iVar4),i_00,in_stack_ffffffffffffffe8);
      in_stack_ffffffffffffffc8 = iVar5;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeLeaveCoPrhs()
{
   assert(type() == LEAVE);

   for(int i = dim() - 1; i >= 0; --i)
   {
      SPxId l_id = this->baseId(i);

      if(l_id.isSPxRowId())
         computeLeaveCoPrhs4Row(i, this->number(SPxRowId(l_id)));
      else
         computeLeaveCoPrhs4Col(i, this->number(SPxColId(l_id)));
   }
}